

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_str_finish(sqlite3_str *p)

{
  sqlite3_str *in_RDI;
  char *z;
  StrAccum *in_stack_ffffffffffffffe8;
  char *local_10;
  
  if ((in_RDI == (sqlite3_str *)0x0) || (in_RDI == &sqlite3OomStr)) {
    local_10 = (char *)0x0;
  }
  else {
    local_10 = sqlite3StrAccumFinish(in_stack_ffffffffffffffe8);
    sqlite3_free((void *)0x1376cb);
  }
  return local_10;
}

Assistant:

SQLITE_API char *sqlite3_str_finish(sqlite3_str *p){
  char *z;
  if( p!=0 && p!=&sqlite3OomStr ){
    z = sqlite3StrAccumFinish(p);
    sqlite3_free(p);
  }else{
    z = 0;
  }
  return z;
}